

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O0

void __thiscall
CRegexStack::push(CRegexStack *this,regex_frame_type typ,int start_ofs,int str_ofs,int curlen,
                 re_state_id state,re_state_id final,int iter)

{
  char *pcVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  CRegexStack *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  regex_stack_entry *fp;
  size_t in_stack_ffffffffffffffc8;
  
  ensure_space(in_RDI,in_stack_ffffffffffffffc8);
  pcVar1 = alloc_space(in_RDI,0x24);
  *(undefined4 *)pcVar1 = in_ESI;
  *(undefined4 *)(pcVar1 + 4) = in_EDX;
  *(undefined4 *)(pcVar1 + 8) = in_ECX;
  *(undefined4 *)(pcVar1 + 0xc) = in_R8D;
  *(undefined4 *)(pcVar1 + 0x10) = in_R9D;
  *(undefined4 *)(pcVar1 + 0x14) = in_stack_00000008;
  *(undefined4 *)(pcVar1 + 0x1c) = fp._0_4_;
  *(int *)(pcVar1 + 0x20) = in_RDI->sp_;
  in_RDI->sp_ = (int)pcVar1 - (int)in_RDI->buf_;
  return;
}

Assistant:

void push(regex_frame_type typ, int start_ofs, int str_ofs, int curlen,
              re_state_id state, re_state_id final, int iter)
    {
        /* 
         *   Ensure we have enough space for the base state structure plus a
         *   full complement of group registers, loop variables, and return
         *   value.  We might not actually need all of the registers and
         *   loop variables, so we won't commit all of this space yet, but
         *   check in advance to make sure we have it so that we don't have
         *   to check again when and if we get around to consuming
         *   group/loop slots.  
         */
        ensure_space(sizeof(regex_stack_entry)
                     + ((RE_GROUP_REG_CNT + RE_LOOP_VARS_MAX + 1)
                        *sizeof(regex_stack_var)));

        /* allocate the base stack frame */
        regex_stack_entry *fp =
            (regex_stack_entry *)alloc_space(sizeof(regex_stack_entry));

        /* set it up */
        fp->typ = typ;
        fp->start_ofs = start_ofs;
        fp->str_ofs = str_ofs;
        fp->curlen = curlen;
        fp->state = state;
        fp->final = final;
        fp->iter = iter;

        /* push it onto the stack */
        fp->prv_sp = sp_;
        sp_ = (char *)fp - buf_;
    }